

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell::
TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell
          (TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell *this)

{
  TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell_0040eb60
  ;
  return;
}

Assistant:

TEST(FailableMemoryAllocator, FailSecondAndFourthMalloc)
{
    failableMallocAllocator->failAllocNumber(2);
    failableMallocAllocator->failAllocNumber(4);
    int *memory1 = (int*)malloc(sizeof(int));
    int *memory2 = (int*)malloc(sizeof(int));
    int *memory3 = (int*)malloc(sizeof(int));
    int *memory4 = (int*)malloc(sizeof(int));

    CHECK(NULLPTR != memory1);
    POINTERS_EQUAL(NULLPTR, memory2);
    CHECK(NULLPTR != memory3);
    POINTERS_EQUAL(NULLPTR, memory4);

    free(memory1);
    free(memory3);
}